

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

char * strstri(char *str,char *sub)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  char local_58 [24];
  char tsub [32];
  char tstr [32];
  
  if (*sub == '\0') {
    return str;
  }
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  tsub[0] = '\0';
  tsub[1] = '\0';
  tsub[2] = '\0';
  tsub[3] = '\0';
  tsub[4] = '\0';
  tsub[5] = '\0';
  tsub[6] = '\0';
  tsub[7] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  tsub[8] = '\0';
  tsub[9] = '\0';
  tsub[10] = '\0';
  tsub[0xb] = '\0';
  tsub[0xc] = '\0';
  tsub[0xd] = '\0';
  tsub[0xe] = '\0';
  tsub[0xf] = '\0';
  tsub[0x10] = '\0';
  tsub[0x11] = '\0';
  tsub[0x12] = '\0';
  tsub[0x13] = '\0';
  tsub[0x14] = '\0';
  tsub[0x15] = '\0';
  tsub[0x16] = '\0';
  tsub[0x17] = '\0';
  tsub[0x18] = '\0';
  tsub[0x19] = '\0';
  tsub[0x1a] = '\0';
  tsub[0x1b] = '\0';
  tsub[0x1c] = '\0';
  tsub[0x1d] = '\0';
  tsub[0x1e] = '\0';
  tsub[0x1f] = '\0';
  uVar4 = 0;
  bVar1 = *str;
  while (bVar1 != 0) {
    tsub[(ulong)(bVar1 & 0x1f) + 8] = tsub[(ulong)(bVar1 & 0x1f) + 8] + '\x01';
    lVar3 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    bVar1 = str[lVar3];
  }
  bVar1 = *sub;
  if (bVar1 != 0) {
    lVar3 = 0;
    do {
      local_58[bVar1 & 0x1f] = local_58[bVar1 & 0x1f] + '\x01';
      bVar1 = sub[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (bVar1 != 0);
    uVar4 = (ulong)(uint)((int)uVar4 - (int)lVar3);
  }
  if (-1 < (int)uVar4) {
    lVar3 = 0;
    do {
      if (tsub[lVar3 + 8] < local_58[lVar3]) {
        return (char *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    uVar8 = 0;
    pcVar5 = str;
    do {
      lVar3 = 0;
      while( true ) {
        bVar1 = pcVar5[lVar3];
        bVar6 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar6 = bVar1;
        }
        bVar1 = sub[lVar3];
        bVar7 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar7 = bVar1;
        }
        if (bVar6 != bVar7) break;
        lVar2 = lVar3 + 1;
        lVar3 = lVar3 + 1;
        if (sub[lVar2] == '\0') {
          return str + uVar8;
        }
      }
      uVar8 = uVar8 + 1;
      pcVar5 = pcVar5 + 1;
    } while (uVar8 != (int)uVar4 + 1);
  }
  return (char *)0x0;
}

Assistant:

char *strstri(const char *str, const char *sub)
{
    const char *s1, *s2;
    int i, k;
# define TABSIZ 0x20	/* 0x40 would be case-sensitive */
    char tstr[TABSIZ], tsub[TABSIZ];	/* nibble count tables */

    /* special case: empty substring */
    if (!*sub)	return (char *) str;

    /* do some useful work while determining relative lengths */
    for (i = 0; i < TABSIZ; i++)  tstr[i] = tsub[i] = 0;	/* init */
    for (k = 0, s1 = str; *s1; k++)  tstr[*s1++ & (TABSIZ-1)]++;
    for (	s2 = sub; *s2; --k)  tsub[*s2++ & (TABSIZ-1)]++;

    /* evaluate the info we've collected */
    if (k < 0)	return NULL;  /* sub longer than str, so can't match */
    for (i = 0; i < TABSIZ; i++)	/* does sub have more 'x's than str? */
	if (tsub[i] > tstr[i])	return NULL;  /* match not possible */

    /* now actually compare the substring repeatedly to parts of the string */
    for (i = 0; i <= k; i++) {
	s1 = &str[i];
	s2 = sub;
	while (lowc(*s1++) == lowc(*s2++))
	    if (!*s2)  return (char *) &str[i];		/* full match */
    }
    return NULL;	/* not found */
}